

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ConcatenationExpression::fromSyntax
          (Compilation *compilation,ConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange operatorRange;
  SourceRange assignmentRange;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  bitwidth_t bVar4;
  size_type sVar5;
  reference ppEVar6;
  Expression *pEVar7;
  long in_RCX;
  Compilation *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  const_iterator cVar8;
  const_iterator cVar9;
  SourceRange SVar10;
  Type *type;
  Expression *expr;
  size_t i;
  Type *type_2;
  Expression *arg_1;
  ExpressionSyntax *argSyntax_1;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<slang::ast::Expression_*,_5UL> buffer;
  bitwidth_t totalWidth;
  bitmask<slang::ast::IntegralFlags> flags;
  bool anyStrings;
  bool unsizedWarned;
  bool errored;
  undefined1 in_stack_000004cf;
  ExpressionSyntax *in_stack_000004d0;
  ASTContext *in_stack_000004d8;
  ConcatenationExpression *result;
  Type *argType;
  Expression *arg;
  ExpressionSyntax *argSyntax;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range3;
  SmallVector<slang::ast::Expression_*,_5UL> buffer_1;
  bool isVirtualIface;
  Type *elemType;
  Type *type_1;
  size_t totalElems;
  bool anyDynamic;
  bool bad;
  Type *in_stack_fffffffffffff998;
  Compilation *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  uint in_stack_fffffffffffff9ac;
  Diagnostic *in_stack_fffffffffffff9b0;
  ASTContext *in_stack_fffffffffffff9b8;
  SourceLocation in_stack_fffffffffffff9c0;
  SourceLocation in_stack_fffffffffffff9c8;
  Compilation *in_stack_fffffffffffff9d0;
  Type *in_stack_fffffffffffff9d8;
  Expression *in_stack_fffffffffffff9e0;
  Type *in_stack_fffffffffffff9e8;
  Diagnostic *in_stack_fffffffffffff9f0;
  Type *in_stack_fffffffffffff9f8;
  ASTContext *in_stack_fffffffffffffa00;
  SourceLocation in_stack_fffffffffffffa10;
  SourceLocation in_stack_fffffffffffffa18;
  Expression *in_stack_fffffffffffffa28;
  Expression *in_stack_fffffffffffffa60;
  Compilation *in_stack_fffffffffffffa68;
  Type *in_stack_fffffffffffffa70;
  bitmask<slang::ast::IntegralFlags> flags_00;
  Expression **in_stack_fffffffffffffb20;
  Expression *in_stack_fffffffffffffb28;
  Type *in_stack_fffffffffffffb30;
  ASTContext *in_stack_fffffffffffffb38;
  SourceLocation in_stack_fffffffffffffb40;
  SourceLocation in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  ASTContext *in_stack_fffffffffffffb60;
  ExpressionSyntax *in_stack_fffffffffffffb68;
  Compilation *in_stack_fffffffffffffb70;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffb78;
  Diagnostic *local_308;
  Type *local_2b0;
  Compilation *pCStack_2a8;
  Expression *local_2a0;
  ulong local_298;
  bitmask<slang::ast::IntegralFlags> local_289;
  SourceRange local_288;
  SourceLocation local_278;
  SourceLocation SStack_270;
  undefined4 local_25c;
  SourceLocation local_258;
  SourceLocation SStack_250;
  undefined4 local_23c;
  Type *local_238;
  bitmask<slang::ast::ASTFlags> local_230;
  bitmask<slang::ast::ASTFlags> local_228;
  Expression *local_220;
  ExpressionSyntax *local_218;
  const_iterator local_210;
  const_iterator local_200;
  long local_1f0;
  SmallVectorBase<slang::ast::Expression_*> local_1e8 [2];
  int local_1a4;
  bitmask<slang::ast::IntegralFlags> local_1a0;
  byte local_19f;
  byte local_19e;
  byte local_19d;
  undefined4 local_19c;
  SourceRange local_198;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_188;
  ConcatenationExpression *local_178;
  ConstantRange local_170;
  SourceRange local_168;
  undefined4 local_154;
  ConstantRange local_150;
  SourceLocation local_148;
  SourceLocation SStack_140;
  undefined4 local_12c;
  ConstantRange local_128;
  Type *local_120;
  SourceLocation local_118;
  SourceLocation SStack_110;
  Expression *local_100;
  bitmask<slang::ast::ASTFlags> local_f8;
  Expression *local_f0;
  ExpressionSyntax *local_e8;
  const_iterator local_e0;
  const_iterator local_c0;
  long local_b0;
  byte local_61;
  Type *local_60;
  long local_58;
  ulong local_50;
  byte local_42;
  byte local_41;
  SourceRange local_40;
  undefined4 local_2c;
  long local_28;
  Compilation *local_20;
  long local_18;
  Compilation *local_10;
  ConcatenationExpression *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RCX == 0) ||
     (local_28 = in_RCX, bVar1 = Type::isUnpackedArray(in_stack_fffffffffffff998), !bVar1)) {
    local_19d = 0;
    local_19e = 0;
    local_19f = 0;
    bitmask<slang::ast::IntegralFlags>::bitmask(&local_1a0);
    local_1a4 = 0;
    SmallVector<slang::ast::Expression_*,_5UL>::SmallVector
              ((SmallVector<slang::ast::Expression_*,_5UL> *)0xa43549);
    local_1f0 = local_18 + 0x28;
    cVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xa4356a);
    local_200 = cVar8;
    cVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xa435a9);
    local_210 = cVar9;
    while( true ) {
      uVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffff9a0,
                         (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                         in_stack_fffffffffffff998);
      if (((uVar3 ^ 0xff) & 1) == 0) break;
      local_218 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                               *)0xa43618);
      if ((local_218->super_SyntaxNode).kind == MultipleConcatenationExpression) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_228,InsideConcatenation);
        local_220 = Expression::create((Compilation *)cVar8.index,(ExpressionSyntax *)cVar9.list,
                                       (ASTContext *)cVar9.index,
                                       (bitmask<slang::ast::ASTFlags>)cVar8.list,
                                       (Type *)CONCAT17(uVar3,in_stack_fffffffffffffb58));
      }
      else {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_230,None);
        local_220 = Expression::create((Compilation *)cVar8.index,(ExpressionSyntax *)cVar9.list,
                                       (ASTContext *)cVar9.index,
                                       (bitmask<slang::ast::ASTFlags>)cVar8.list,
                                       (Type *)CONCAT17(uVar3,in_stack_fffffffffffffb58));
      }
      SmallVectorBase<slang::ast::Expression_*>::push_back
                ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9a0,
                 (Expression **)in_stack_fffffffffffff998);
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff9a0);
      if (bVar1) {
        local_19d = 1;
        break;
      }
      local_238 = not_null<const_slang::ast::Type_*>::operator*
                            ((not_null<const_slang::ast::Type_*> *)0xa437df);
      bVar1 = Type::isVoid((Type *)0xa43806);
      if ((!bVar1) || ((local_218->super_SyntaxNode).kind != MultipleConcatenationExpression)) {
        bVar1 = Type::isString((Type *)0xa4383e);
        if (bVar1) {
          local_19f = 1;
        }
        else {
          bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffff9a0);
          if (!bVar1) {
            local_19d = 1;
            local_23c = 0x210007;
            local_258 = (local_220->sourceRange).startLoc;
            SStack_250 = (local_220->sourceRange).endLoc;
            sourceRange_01.endLoc = in_stack_fffffffffffff9c8;
            sourceRange_01.startLoc = in_stack_fffffffffffff9c0;
            ASTContext::addDiag(in_stack_fffffffffffff9b8,
                                SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange_01);
            ast::operator<<(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
            break;
          }
          bVar1 = Expression::isUnsizedInteger
                            ((Expression *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          if ((bVar1) && ((local_19e & 1) == 0)) {
            local_25c = 0xd80007;
            local_278 = (local_220->sourceRange).startLoc;
            SStack_270 = (local_220->sourceRange).endLoc;
            sourceRange_02.endLoc = in_stack_fffffffffffff9c8;
            sourceRange_02.startLoc = in_stack_fffffffffffff9c0;
            ASTContext::addDiag(in_stack_fffffffffffff9b8,
                                SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange_02);
            Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
            ;
            Diagnostic::operator<<<unsigned_int>
                      (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
            local_19e = 1;
          }
          bVar4 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffff9ac,
                                                     in_stack_fffffffffffff9a8));
          local_1a4 = local_1a4 + bVar4;
          SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
          range.endLoc = in_stack_fffffffffffff9c8;
          range.startLoc = in_stack_fffffffffffff9c0;
          local_288 = SVar10;
          bVar1 = ASTContext::requireValidBitWidth
                            (in_stack_fffffffffffff9b8,
                             (bitwidth_t)((ulong)in_stack_fffffffffffff9b0 >> 0x20),range);
          if (!bVar1) {
            local_19d = 1;
            break;
          }
          bVar1 = Type::isFourState(in_stack_fffffffffffff9f8);
          if (bVar1) {
            bitmask<slang::ast::IntegralFlags>::bitmask(&local_289,FourState);
            bitmask<slang::ast::IntegralFlags>::operator|=(&local_1a0,&local_289);
          }
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                  *)in_stack_fffffffffffff9a0);
    }
    flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffa70 >> 0x38);
    bVar4 = (bitwidth_t)((ulong)in_stack_fffffffffffffa60 >> 0x20);
    if ((local_19d & 1) == 0) {
      local_298 = 0;
      while( true ) {
        sVar5 = SmallVectorBase<slang::ast::Expression_*>::size(local_1e8);
        flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffa70 >> 0x38);
        bVar4 = (bitwidth_t)((ulong)in_stack_fffffffffffffa60 >> 0x20);
        if (sVar5 <= local_298) break;
        if ((local_19f & 1) == 0) {
          SmallVectorBase<slang::ast::Expression_*>::operator[](local_1e8,local_298);
          Expression::selfDetermined
                    ((ASTContext *)in_stack_fffffffffffff9f0,
                     (Expression **)in_stack_fffffffffffff9e8);
        }
        else {
          ppEVar6 = SmallVectorBase<slang::ast::Expression_*>::operator[](local_1e8,local_298);
          local_2a0 = *ppEVar6;
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa43bbb);
          bVar1 = Type::isString((Type *)0xa43bd2);
          flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffa70 >> 0x38);
          bVar4 = (bitwidth_t)((ulong)in_stack_fffffffffffffa60 >> 0x20);
          if (bVar1) {
            Expression::selfDetermined
                      ((ASTContext *)in_stack_fffffffffffff9f0,
                       (Expression **)in_stack_fffffffffffff9e8);
          }
          else {
            bVar1 = Expression::isImplicitString(in_stack_fffffffffffffa28);
            if (!bVar1) {
              local_19d = 1;
              sourceRange_03.endLoc = in_stack_fffffffffffff9c8;
              sourceRange_03.startLoc = in_stack_fffffffffffff9c0;
              ASTContext::addDiag(in_stack_fffffffffffff9b8,
                                  SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange_03);
              break;
            }
            in_stack_fffffffffffffa68 = local_20;
            in_stack_fffffffffffffa70 = Compilation::getStringType(local_10);
            SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffff9a0);
            operatorRange.endLoc = in_stack_fffffffffffffa18;
            operatorRange.startLoc = in_stack_fffffffffffffa10;
            in_stack_fffffffffffff998 = local_2b0;
            in_stack_fffffffffffff9a0 = pCStack_2a8;
            pEVar7 = ConversionExpression::makeImplicit
                               (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                (ConversionKind)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                                (Expression *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                                operatorRange);
            in_stack_fffffffffffffa60 = local_2a0;
            local_2a0 = pEVar7;
          }
          ppEVar6 = SmallVectorBase<slang::ast::Expression_*>::operator[](local_1e8,local_298);
          *ppEVar6 = local_2a0;
        }
        local_298 = local_298 + 1;
      }
      if (((local_19f & 1) == 0) && (local_1a4 == 0)) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
        sourceRange_04.endLoc = in_stack_fffffffffffff9c8;
        sourceRange_04.startLoc = in_stack_fffffffffffff9c0;
        ASTContext::addDiag(in_stack_fffffffffffff9b8,
                            SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange_04);
        local_19d = 1;
      }
    }
    if ((local_19d & 1) == 0) {
      if ((local_19f & 1) == 0) {
        local_308 = (Diagnostic *)Compilation::getType(in_stack_fffffffffffffa68,bVar4,flags_00);
      }
      else {
        in_stack_fffffffffffff9f0 = (Diagnostic *)Compilation::getStringType(local_10);
        local_308 = in_stack_fffffffffffff9f0;
      }
      SmallVectorBase<slang::ast::Expression_*>::ccopy
                ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9c0,
                 (BumpAllocator *)in_stack_fffffffffffff9b8);
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
      local_8 = BumpAllocator::
                emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                          ((BumpAllocator *)local_308,(Type *)local_10,
                           (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           SVar10.startLoc,(SourceRange *)SVar10.endLoc);
    }
    else {
      Compilation::getErrorType(local_10);
      std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::span
                ((span<const_slang::ast::Expression_*,_18446744073709551615UL> *)0xa43e55);
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
      BumpAllocator::
      emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                ((BumpAllocator *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                 (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffff9d0,(SourceRange *)in_stack_fffffffffffff9c8);
      local_8 = (ConcatenationExpression *)
                Expression::badExpr(in_stack_fffffffffffff9a0,
                                    (Expression *)in_stack_fffffffffffff998);
    }
    local_19c = 1;
    SmallVector<slang::ast::Expression_*,_5UL>::~SmallVector
              ((SmallVector<slang::ast::Expression_*,_5UL> *)0xa44020);
  }
  else {
    bVar1 = Type::isAssociativeArray((Type *)0xa42bf9);
    if (bVar1) {
      local_2c = 0xa60007;
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
      SVar10.endLoc = in_stack_fffffffffffff9c8;
      SVar10.startLoc = in_stack_fffffffffffff9c0;
      ASTContext::addDiag(in_stack_fffffffffffff9b8,
                          SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),SVar10);
      local_8 = (ConcatenationExpression *)
                Expression::badExpr(in_stack_fffffffffffff9a0,
                                    (Expression *)in_stack_fffffffffffff998);
    }
    else {
      local_41 = 0;
      local_42 = 0;
      local_50 = 0;
      local_58 = local_28;
      local_60 = Type::getArrayElementType
                           ((Type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_61 = Type::isVirtualInterface((Type *)0xa42cc9);
      SmallVector<slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<slang::ast::Expression_*,_5UL> *)0xa42cdd);
      local_b0 = local_18 + 0x28;
      local_c0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xa42cfe);
      local_e0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xa42d3d);
      while( true ) {
        bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffff9a0,
                           (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                           in_stack_fffffffffffff998);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_e8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                   ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                                *)0xa42dac);
        local_f0 = (Expression *)0x0;
        if ((local_61 & 1) != 0) {
          local_f0 = Expression::tryBindInterfaceRef
                               (in_stack_000004d8,in_stack_000004d0,(bool)in_stack_000004cf);
        }
        if (local_f0 == (Expression *)0x0) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_f8,None);
          local_f0 = Expression::create(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                        in_stack_fffffffffffffb60,in_stack_fffffffffffffb78,
                                        (Type *)CONCAT17(in_stack_fffffffffffffb5f,
                                                         in_stack_fffffffffffffb58));
        }
        bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff9a0);
        if (bVar1) {
          local_41 = 1;
        }
        else {
          bVar1 = Expression::isImplicitlyAssignableTo
                            ((Expression *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                             (Type *)in_stack_fffffffffffff9c8);
          if (bVar1) {
            local_118 = (local_f0->sourceRange).startLoc;
            SStack_110 = (local_f0->sourceRange).endLoc;
            in_stack_fffffffffffff998 = (Type *)0x0;
            assignmentRange.endLoc = in_stack_fffffffffffffb48;
            assignmentRange.startLoc = in_stack_fffffffffffffb40;
            local_100 = Expression::convertAssignment
                                  (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                                   in_stack_fffffffffffffb28,assignmentRange,
                                   in_stack_fffffffffffffb20,
                                   (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffb60);
            SmallVectorBase<slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9a0,
                       (Expression **)in_stack_fffffffffffff998);
            local_50 = local_50 + 1;
          }
          else {
            local_120 = not_null<const_slang::ast::Type_*>::operator*
                                  ((not_null<const_slang::ast::Type_*> *)0xa42fdd);
            bVar1 = Type::isUnpackedArray(in_stack_fffffffffffff998);
            if (bVar1) {
              Type::getArrayElementType
                        ((Type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              bVar1 = Type::isAssignmentCompatible
                                (in_stack_fffffffffffff9f8,(Type *)in_stack_fffffffffffff9f0);
              if (bVar1) {
                bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffff9a0);
                if (bVar1) {
                  local_128 = Type::getFixedRange(in_stack_fffffffffffff998);
                  bVar4 = ConstantRange::width((ConstantRange *)0xa430c9);
                  local_50 = bVar4 + local_50;
                }
                else {
                  local_42 = 1;
                }
                Expression::selfDetermined
                          ((ASTContext *)in_stack_fffffffffffff9f0,
                           (Expression **)in_stack_fffffffffffff9e8);
                SmallVectorBase<slang::ast::Expression_*>::push_back
                          ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9a0,
                           (Expression **)in_stack_fffffffffffff998);
                goto LAB_00a431c4;
              }
            }
            local_41 = 1;
            local_12c = 0x210007;
            local_148 = (local_f0->sourceRange).startLoc;
            SStack_140 = (local_f0->sourceRange).endLoc;
            sourceRange.endLoc = in_stack_fffffffffffff9c8;
            sourceRange.startLoc = in_stack_fffffffffffff9c0;
            ASTContext::addDiag(in_stack_fffffffffffff9b8,
                                SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange);
            ast::operator<<(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
            Expression::selfDetermined
                      ((ASTContext *)in_stack_fffffffffffff9f0,
                       (Expression **)in_stack_fffffffffffff9e8);
            SmallVectorBase<slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9a0,
                       (Expression **)in_stack_fffffffffffff998);
          }
        }
LAB_00a431c4:
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffff9a0);
      }
      bVar1 = false;
      if (((local_41 & 1) == 0) && (bVar1 = false, (local_42 & 1) == 0)) {
        bVar2 = Type::hasFixedRange((Type *)in_stack_fffffffffffff9a0);
        bVar1 = false;
        if (bVar2) {
          local_150 = Type::getFixedRange(in_stack_fffffffffffff998);
          bVar4 = ConstantRange::width((ConstantRange *)0xa43267);
          bVar1 = bVar4 != local_50;
        }
      }
      if (bVar1) {
        local_154 = 0xa70007;
        local_168 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
        sourceRange_00.endLoc = in_stack_fffffffffffff9c8;
        sourceRange_00.startLoc = in_stack_fffffffffffff9c0;
        ASTContext::addDiag(in_stack_fffffffffffff9b8,
                            SUB84((ulong)in_stack_fffffffffffff9d0 >> 0x20,0),sourceRange_00);
        ast::operator<<(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
        local_170 = Type::getFixedRange(in_stack_fffffffffffff998);
        ConstantRange::width((ConstantRange *)0xa43376);
        Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffff9b0,
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        local_41 = 1;
      }
      local_188 = SmallVectorBase<slang::ast::Expression_*>::ccopy
                            ((SmallVectorBase<slang::ast::Expression_*> *)in_stack_fffffffffffff9c0,
                             (BumpAllocator *)in_stack_fffffffffffff9b8);
      local_198 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff9f0);
      local_178 = BumpAllocator::
                  emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                            (&in_stack_fffffffffffff9d0->super_BumpAllocator,
                             (Type *)in_stack_fffffffffffff9c8,
                             (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             in_stack_fffffffffffff9c0,(SourceRange *)in_stack_fffffffffffff9b8);
      local_8 = local_178;
      if ((local_41 & 1) != 0) {
        local_8 = (ConcatenationExpression *)
                  Expression::badExpr(in_stack_fffffffffffff9a0,
                                      (Expression *)in_stack_fffffffffffff998);
      }
      local_19c = 1;
      SmallVector<slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<slang::ast::Expression_*,_5UL> *)0xa43507);
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& ConcatenationExpression::fromSyntax(Compilation& compilation,
                                                const ConcatenationExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type* assignmentTarget) {
    // If we are in an assignment-like context with a target type that is an unpacked array,
    // this is an array concatenation (as opposed to a vector or string concatenation).
    if (assignmentTarget && assignmentTarget->isUnpackedArray()) {
        if (assignmentTarget->isAssociativeArray()) {
            context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
            return badExpr(compilation, nullptr);
        }

        bool bad = false;
        bool anyDynamic = false;
        size_t totalElems = 0;
        const Type& type = *assignmentTarget;
        const Type& elemType = *type.getArrayElementType();
        const bool isVirtualIface = elemType.isVirtualInterface();
        SmallVector<Expression*> buffer;

        for (auto argSyntax : syntax.expressions) {
            Expression* arg = nullptr;
            if (isVirtualIface) {
                arg = tryBindInterfaceRef(context, *argSyntax,
                                          /* isInterfacePort */ false);
            }

            if (!arg)
                arg = &create(compilation, *argSyntax, context);

            if (arg->bad()) {
                bad = true;
                continue;
            }

            if (arg->isImplicitlyAssignableTo(compilation, elemType)) {
                buffer.push_back(&convertAssignment(context, elemType, *arg, arg->sourceRange));
                totalElems++;
                continue;
            }

            // The argument can be an unpacked array as long as its element type is
            // assignment compatible with the target.
            auto& argType = *arg->type;
            if (argType.isUnpackedArray() &&
                elemType.isAssignmentCompatible(*argType.getArrayElementType())) {
                // If this is a dynamic array we can't check element counts statically.
                // Otherwise we should count each fixed element in the total.
                if (argType.hasFixedRange())
                    totalElems += argType.getFixedRange().width();
                else
                    anyDynamic = true;

                selfDetermined(context, arg);
                buffer.push_back(arg);
                continue;
            }

            // Otherwise this is an error.
            bad = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << argType;
            selfDetermined(context, arg);
            buffer.push_back(arg);
        }

        // If we have a fixed size source and target, check that they match in size.
        if (!bad && !anyDynamic && type.hasFixedRange() &&
            type.getFixedRange().width() != totalElems) {
            context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
                << type << type.getFixedRange().width() << totalElems;
            bad = true;
        }

        auto result = compilation.emplace<ConcatenationExpression>(type, buffer.ccopy(compilation),
                                                                   syntax.sourceRange());
        if (bad)
            return badExpr(compilation, result);

        return *result;
    }

    bool errored = false;
    bool unsizedWarned = false;
    bool anyStrings = false;
    bitmask<IntegralFlags> flags;
    bitwidth_t totalWidth = 0;
    SmallVector<Expression*> buffer;

    for (auto argSyntax : syntax.expressions) {
        // Replications inside of concatenations have a special feature that allows them to have
        // a width of zero. Check now if we're going to be creating a replication and if so set
        // an additional flag so that it knows it's ok to have that zero count.
        Expression* arg;
        if (argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            arg = &create(compilation, *argSyntax, context, ASTFlags::InsideConcatenation);
        else
            arg = &create(compilation, *argSyntax, context);
        buffer.push_back(arg);

        if (arg->bad()) {
            errored = true;
            break;
        }

        const Type& type = *arg->type;
        if (type.isVoid() && argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            continue;

        if (type.isString()) {
            anyStrings = true;
            continue;
        }

        if (!type.isIntegral()) {
            errored = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << type;
            break;
        }

        if (arg->isUnsizedInteger() && !unsizedWarned) {
            context.addDiag(diag::UnsizedInConcat, arg->sourceRange) << type.getBitWidth();
            unsizedWarned = true;
        }

        // Can't overflow because 2*maxWidth is still less than 2^32-1.
        totalWidth += type.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax.sourceRange())) {
            errored = true;
            break;
        }

        if (type.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (!errored) {
        for (size_t i = 0; i < buffer.size(); i++) {
            if (!anyStrings) {
                selfDetermined(context, buffer[i]);
            }
            else {
                Expression* expr = buffer[i];
                if (expr->type->isString()) {
                    selfDetermined(context, expr);
                }
                else if (expr->isImplicitString()) {
                    expr = &ConversionExpression::makeImplicit(context, compilation.getStringType(),
                                                               ConversionKind::Implicit, *expr,
                                                               nullptr, {});
                }
                else {
                    errored = true;
                    context.addDiag(diag::ConcatWithStringInt, expr->sourceRange);
                    break;
                }
                buffer[i] = expr;
            }
        }

        if (!anyStrings && totalWidth == 0) {
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
            errored = true;
        }
    }

    if (errored) {
        return badExpr(compilation,
                       compilation.emplace<ConcatenationExpression>(compilation.getErrorType(),
                                                                    std::span<const Expression*>(),
                                                                    syntax.sourceRange()));
    }

    const Type* type;
    if (anyStrings)
        type = &compilation.getStringType();
    else
        type = &compilation.getType(totalWidth, flags);

    return *compilation.emplace<ConcatenationExpression>(*type, buffer.ccopy(compilation),
                                                         syntax.sourceRange());
}